

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ezexample.h
# Opt level: O0

example * __thiscall ezexample::get_new_example(ezexample *this)

{
  example *peVar1;
  vw *in_RDI;
  size_t i;
  example *new_ec;
  ulong local_18;
  
  peVar1 = VW::new_unused_example(in_RDI);
  (*(code *)(in_RDI->p->words)._end[0x33].end)(&peVar1->l);
  v_array<char>::clear((v_array<char> *)in_RDI);
  v_array<unsigned_char>::clear((v_array<unsigned_char> *)in_RDI);
  for (local_18 = 0; local_18 < 0x100; local_18 = local_18 + 1) {
    features::clear((features *)in_RDI);
  }
  (peVar1->super_example_predict).ft_offset = 0;
  peVar1->num_features = 0;
  peVar1->partial_prediction = 0.0;
  peVar1->updated_prediction = 0.0;
  peVar1->passthrough = (features *)0x0;
  peVar1->loss = 0.0;
  peVar1->total_sum_feat_sq = 0.0;
  peVar1->confidence = 0.0;
  return peVar1;
}

Assistant:

example* get_new_example()
  {
    example* new_ec = VW::new_unused_example(*vw_par_ref);
    vw_par_ref->p->lp.default_label(&new_ec->l);
    new_ec->tag.clear();
    new_ec->indices.clear();
    for (size_t i = 0; i < 256; i++) new_ec->feature_space[i].clear();

    new_ec->ft_offset = 0;
    new_ec->num_features = 0;
    new_ec->partial_prediction = 0.;
    new_ec->updated_prediction = 0.;
    new_ec->passthrough = nullptr;
    new_ec->loss = 0.;
    new_ec->total_sum_feat_sq = 0.;
    new_ec->confidence = 0.;
    return new_ec;
  }